

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shaft.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::Shaft::Encode(Shaft *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  Shaft *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_i16CurrentRPM);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i16OrderedRPM);
  KDataStream::operator<<(pKVar1,this->m_i32RPMRateOfChange);
  return;
}

Assistant:

void Shaft::Encode( KDataStream & stream ) const
{
    stream << m_i16CurrentRPM
           << m_i16OrderedRPM
           << m_i32RPMRateOfChange;
}